

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excp_helper.c
# Opt level: O0

_Bool ppc_cpu_exec_interrupt_ppc64(CPUState *cs,int interrupt_request)

{
  CPUPPCState_conflict2 *env;
  PowerPCCPU_conflict3 *cpu;
  int interrupt_request_local;
  CPUState *cs_local;
  
  if ((interrupt_request & 2U) == 0) {
    cs_local._7_1_ = false;
  }
  else {
    ppc_hw_interrupt((CPUPPCState_conflict2 *)(cs[1].tb_jmp_cache + 0x359));
    if (*(int *)((long)cs[3].tb_jmp_cache + 0x46ec) == 0) {
      cs->interrupt_request = cs->interrupt_request & 0xfffffffd;
    }
    cs_local._7_1_ = true;
  }
  return cs_local._7_1_;
}

Assistant:

bool ppc_cpu_exec_interrupt(CPUState *cs, int interrupt_request)
{
    PowerPCCPU *cpu = POWERPC_CPU(cs);
    CPUPPCState *env = &cpu->env;

    if (interrupt_request & CPU_INTERRUPT_HARD) {
        ppc_hw_interrupt(env);
        if (env->pending_interrupts == 0) {
            cs->interrupt_request &= ~CPU_INTERRUPT_HARD;
        }
        return true;
    }
    return false;
}